

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
parse(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
     item_event_visitor *visitor,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer *pppVar1;
  pointer ppVar2;
  pointer ppVar3;
  ushort uVar4;
  assertion_error *this_01;
  string local_50;
  
  if (this->done_ == false) {
    this_00 = &this->source_;
    do {
      if (this->more_ != true) {
        return;
      }
      ppVar2 = (this->state_stack_).
               super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar2[-1].mode) {
      case root:
        ppVar2[-1].mode = accept;
        goto LAB_00278a32;
      case accept:
        ppVar3 = (this->state_stack_).
                 super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)ppVar2 - (long)ppVar3 != 0x20) {
          this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                     "");
          assertion_error::assertion_error(this_01,&local_50);
          __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ppVar2 != ppVar3) {
          (this->state_stack_).
          super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
        }
        this->more_ = false;
        this->done_ = true;
        (*visitor->_vptr_basic_item_event_visitor[2])(visitor);
        break;
      case array:
        if (ppVar2[-1].index < ppVar2[-1].length) {
          ppVar2[-1].index = ppVar2[-1].index + 1;
          goto LAB_00278a32;
        }
        end_array(this,visitor,ec);
        break;
      case indefinite_array:
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(this_00);
        }
        if ((this->source_).buffer_length_ == 0) {
          uVar4 = 0x100;
        }
        else {
          uVar4 = (ushort)*(this->source_).buffer_data_;
        }
        if (uVar4 < 0x100) {
          if (uVar4 == 0xff) {
            stream_source<unsigned_char>::ignore(this_00,1);
            end_array(this,visitor,ec);
          }
          else {
LAB_00278a0f:
            read_item(this,visitor,ec);
          }
        }
        else {
LAB_00278a50:
          std::error_code::operator=(ec,unexpected_eof);
          this->more_ = false;
        }
        goto LAB_00278a1d;
      case map_key:
        if (ppVar2[-1].index < ppVar2[-1].length) {
          ppVar2[-1].index = ppVar2[-1].index + 1;
          ppVar2[-1].mode = map_value;
          goto LAB_00278a32;
        }
        end_object(this,visitor,ec);
        break;
      case map_value:
        ppVar2[-1].mode = map_key;
        goto LAB_00278a32;
      case indefinite_map_key:
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(this_00);
        }
        if ((this->source_).buffer_length_ == 0) {
          uVar4 = 0x100;
        }
        else {
          uVar4 = (ushort)*(this->source_).buffer_data_;
        }
        if (0xff < uVar4) goto LAB_00278a50;
        if (uVar4 != 0xff) {
          (this->state_stack_).
          super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].mode = indefinite_map_value;
          goto LAB_00278a0f;
        }
        stream_source<unsigned_char>::ignore(this_00,1);
        end_object(this,visitor,ec);
LAB_00278a1d:
        if (0xff < uVar4) {
          return;
        }
        break;
      case indefinite_map_value:
        ppVar2[-1].mode = indefinite_map_key;
LAB_00278a32:
        read_item(this,visitor,ec);
        break;
      case multi_dim:
        if (ppVar2[-1].index == 0) {
          ppVar2[-1].index = 1;
          goto LAB_00278a32;
        }
        (*visitor->_vptr_basic_item_event_visitor[0x1e])(visitor,this,ec);
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
        pppVar1 = &(this->state_stack_).
                   super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
    } while (this->done_ != true);
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::multi_dim:
                {
                    if (state_stack_.back().index == 0)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        produce_end_multi_dim(visitor, ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                    }
                    else
                    {
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                    }
                    else
                    {
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }